

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptTessellationDeclType(HlslGrammar *this,TBuiltInVariable *patchType)

{
  EHlslTokenClass EVar1;
  EHlslTokenClass tessType;
  TBuiltInVariable *patchType_local;
  HlslGrammar *this_local;
  
  EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (EVar1 == EHTokInputPatch) {
    *patchType = EbvInputPatch;
  }
  else {
    if (EVar1 != EHTokOutputPatch) {
      return false;
    }
    *patchType = EbvOutputPatch;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  return true;
}

Assistant:

bool HlslGrammar::acceptTessellationDeclType(TBuiltInVariable& patchType)
{
    // read geometry type
    const EHlslTokenClass tessType = peek();

    switch (tessType) {
    case EHTokInputPatch:    patchType = EbvInputPatch;  break;
    case EHTokOutputPatch:   patchType = EbvOutputPatch; break;
    default:
        return false;  // not a tessellation decl
    }

    advanceToken();  // consume the keyword
    return true;
}